

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_get_cookie(char *cookie_header,char *var_name,char *dst,size_t dst_size)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *__s;
  ulong uStack_50;
  
  if (dst_size == 0 || dst == (char *)0x0) {
    uStack_50 = 0xfffffffffffffffe;
  }
  else {
    *dst = '\0';
    uStack_50 = 0xffffffffffffffff;
    if (cookie_header != (char *)0x0 && var_name != (char *)0x0) {
      sVar1 = strlen(var_name);
      sVar2 = strlen(cookie_header);
      pcVar5 = cookie_header;
      do {
        pcVar3 = mg_strcasestr(pcVar5,var_name);
        if (pcVar3 == (char *)0x0) goto LAB_0010df7d;
        pcVar5 = pcVar3 + (int)sVar1;
      } while ((pcVar3[(int)sVar1] != '=') || ((pcVar3 != cookie_header && (pcVar3[-1] != ' '))));
      lVar6 = (long)((sVar1 << 0x20) + 0x100000000) >> 0x20;
      __s = pcVar3 + lVar6;
      pcVar4 = strchr(__s,0x20);
      pcVar5 = cookie_header + sVar2;
      if (pcVar4 != (char *)0x0) {
        pcVar5 = pcVar4;
      }
      pcVar4 = pcVar5 + -1;
      if (pcVar5[-1] != ';') {
        pcVar4 = pcVar5;
      }
      if ((pcVar3[lVar6] == '\"') && (pcVar4[-1] == '\"')) {
        if (__s + 1 < pcVar4) {
          __s = __s + 1;
          pcVar4 = pcVar4 + -1;
        }
      }
      uStack_50 = (long)pcVar4 - (long)__s;
      if (uStack_50 < dst_size) {
        mg_strlcpy(dst,__s,(long)(int)uStack_50 + 1);
      }
      else {
        uStack_50 = 0xfffffffffffffffd;
      }
    }
  }
LAB_0010df7d:
  return (int)uStack_50;
}

Assistant:

CIVETWEB_API int
mg_get_cookie(const char *cookie_header,
              const char *var_name,
              char *dst,
              size_t dst_size)
{
	const char *s, *p, *end;
	int name_len, len = -1;

	if ((dst == NULL) || (dst_size == 0)) {
		return -2;
	}

	dst[0] = '\0';
	if ((var_name == NULL) || ((s = cookie_header) == NULL)) {
		return -1;
	}

	name_len = (int)strlen(var_name);
	end = s + strlen(s);
	for (; (s = mg_strcasestr(s, var_name)) != NULL; s += name_len) {
		if (s[name_len] == '=') {
			/* HCP24: now check is it a substring or a full cookie name */
			if ((s == cookie_header) || (s[-1] == ' ')) {
				s += name_len + 1;
				if ((p = strchr(s, ' ')) == NULL) {
					p = end;
				}
				if (p[-1] == ';') {
					p--;
				}
				if ((*s == '"') && (p[-1] == '"') && (p > s + 1)) {
					s++;
					p--;
				}
				if ((size_t)(p - s) < dst_size) {
					len = (int)(p - s);
					mg_strlcpy(dst, s, (size_t)len + 1);
				} else {
					len = -3;
				}
				break;
			}
		}
	}
	return len;
}